

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

ImPlotPlot * __thiscall ImPool<ImPlotPlot>::Add(ImPool<ImPlotPlot> *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ImPlotPlot *__src;
  ImGuiID IVar5;
  ImPlotPlot *__dest;
  int iVar6;
  
  uVar2 = (this->Buf).Size;
  uVar3 = this->FreeIdx;
  if (uVar3 == uVar2) {
    iVar1 = uVar2 + 1;
    iVar4 = (this->Buf).Capacity;
    if (iVar4 <= (int)uVar2) {
      if (iVar4 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar4 / 2 + iVar4;
      }
      if (iVar6 <= iVar1) {
        iVar6 = iVar1;
      }
      if (iVar4 < iVar6) {
        __dest = (ImPlotPlot *)ImGui::MemAlloc((long)iVar6 * 0x2f8);
        __src = (this->Buf).Data;
        if (__src != (ImPlotPlot *)0x0) {
          memcpy(__dest,__src,(long)(this->Buf).Size * 0x2f8);
          ImGui::MemFree((this->Buf).Data);
        }
        (this->Buf).Data = __dest;
        (this->Buf).Capacity = iVar6;
      }
    }
    (this->Buf).Size = iVar1;
    IVar5 = this->FreeIdx + 1;
  }
  else {
    if (((int)uVar3 < 0) || ((int)uVar2 <= (int)uVar3)) goto LAB_001c1e01;
    IVar5 = (this->Buf).Data[uVar3].ID;
  }
  this->FreeIdx = IVar5;
  if ((-1 < (int)uVar3) && ((int)uVar3 < (this->Buf).Size)) {
    ImPlotPlot::ImPlotPlot((this->Buf).Data + uVar3);
    this->AliveCount = this->AliveCount + 1;
    if ((int)uVar3 < (this->Buf).Size) {
      return (this->Buf).Data + uVar3;
    }
  }
LAB_001c1e01:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                ,0x68b,"T &ImVector<ImPlotPlot>::operator[](int) [T = ImPlotPlot]");
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); AliveCount++; return &Buf[idx]; }